

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O2

bool __thiscall Arbitraryforward_list::Run(Arbitraryforward_list *this)

{
  long lVar1;
  long lVar2;
  forward_list<int,_std::allocator<int>_> *pfVar3;
  _Fwd_list_impl _Var4;
  long lVar5;
  forward_list<int,_std::allocator<int>_> v;
  vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
  vv;
  
  pfVar3 = &v;
  testinator::Arbitrary<std::forward_list<int,_std::allocator<int>_>_>::generate
            ((Arbitrary<std::forward_list<int,_std::allocator<int>_>_> *)&v,1,0);
  testinator::Arbitrary<std::forward_list<int,_std::allocator<int>_>_>::shrink(&vv,&v);
  lVar1 = -1;
  do {
    pfVar3 = *(forward_list<int,_std::allocator<int>_> **)pfVar3;
    lVar1 = lVar1 + 1;
  } while (pfVar3 != (forward_list<int,_std::allocator<int>_> *)0x0);
  if (vv.
      super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      vv.
      super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar2 = 0;
  }
  else {
    lVar2 = -1;
    _Var4._M_head._M_next =
         (_Fwd_list_node_base)
         (_Fwd_list_node_base)
         vv.
         super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    do {
      _Var4._M_head._M_next =
           (_Fwd_list_node_base)((_Fwd_list_node_base *)_Var4._M_head._M_next)->_M_next;
      lVar2 = lVar2 + 1;
    } while ((_Fwd_list_impl)_Var4._M_head._M_next != (_Fwd_list_impl)0x0);
    if (8 < (ulong)((long)vv.
                          super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)vv.
                         super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)) {
      _Var4._M_head._M_next =
           (_Fwd_list_node_base)
           (vv.
            super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 1);
      lVar5 = -1;
      do {
        _Var4._M_head._M_next = *(_Fwd_list_node_base *)_Var4._M_head._M_next;
        lVar5 = lVar5 + 1;
      } while ((_Fwd_list_impl)_Var4._M_head._M_next != (_Fwd_list_impl)0x0);
      goto LAB_0014f4b6;
    }
  }
  lVar5 = 0;
LAB_0014f4b6:
  std::
  vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
  ::~vector(&vv);
  std::_Fwd_list_base<int,_std::allocator<int>_>::~_Fwd_list_base
            (&v.super__Fwd_list_base<int,_std::allocator<int>_>);
  return lVar2 + lVar5 == lVar1 &&
         (long)vv.
               super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)vv.
               super__Vector_base<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start == 0x10;
}

Assistant:

DEF_TEST(forward_list, Arbitrary)
{
  testinator::Arbitrary<forward_list<int>> a;
  forward_list<int> v = a.generate(1,0);
  vector<forward_list<int>> vv = a.shrink(v);

  std::size_t vlen = 0;
  for (auto it = v.begin(); it != v.end(); ++it, ++vlen);

  std::size_t vv0len = 0;
  std::size_t vv1len = 0;
  if (vv.size() > 0)
    for (auto it = vv[0].begin(); it != vv[0].end(); ++it, ++vv0len);
  if (vv.size() > 1)
    for (auto it = vv[1].begin(); it != vv[1].end(); ++it, ++vv1len);

  return vv.size() == 2
    && vv0len + vv1len == vlen;
}